

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool __thiscall
cmListCommand::HandleSortCommand
          (cmListCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  _Iter_comp_iter<cmStringSorter> __comp;
  _Iter_comp_iter<cmStringSorter> __comp_00;
  undefined8 __first;
  undefined8 __last;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  bool bVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string error;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string messageHint;
  undefined1 local_168 [40];
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  uint local_100;
  uint local_fc;
  cmCommand *local_f8;
  uint local_ec;
  string local_e8;
  long *local_c0 [2];
  long local_b0 [2];
  string local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  undefined4 local_34;
  
  uVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  local_f8 = &this->super_cmCommand;
  local_40 = args;
  if (uVar4 < 2) {
    __assert_fail("args.size() >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmListCommand.cxx"
                  ,0x495,"bool cmListCommand::HandleSortCommand(const std::vector<std::string> &)");
  }
  paVar9 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar9;
  if (8 < uVar4) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"sub-command SORT only takes up to six arguments.","");
    cmCommand::SetError(local_f8,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar9) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"sub-command SORT ","");
  local_100 = 0;
  local_fc = 0;
  local_ec = 0;
  uVar4 = 2;
  while( true ) {
    pbVar1 = (local_40->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(local_40->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    bVar11 = (ulong)(lVar5 >> 5) <= uVar4;
    local_34 = (undefined4)CONCAT71((int7)(lVar5 >> 0xd),bVar11);
    if (bVar11) break;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pcVar2 = pbVar1[uVar4]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar2,pcVar2 + pbVar1[uVar4]._M_string_length);
    uVar10 = uVar4 + 1;
    iVar3 = std::__cxx11::string::compare((char *)&local_e8);
    if (iVar3 == 0) {
      if (local_ec != 0) {
        local_140 = &local_130;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_a0._M_dataplus._M_p,
                   local_a0._M_dataplus._M_p + local_a0._M_string_length);
        std::__cxx11::string::append((char *)&local_140);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_140,(ulong)local_e8._M_dataplus._M_p);
        local_168._0_8_ = local_168 + 0x10;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar7)
        {
          local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_168._24_8_ = plVar6[3];
        }
        else {
          local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_168._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
        }
        local_168._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append(local_168);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar9) {
          local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_110._8_8_ = plVar6[3];
          local_120._0_8_ = &local_110;
        }
        else {
          local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_120._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
        }
        local_120._8_8_ = plVar6[1];
        *plVar6 = (long)paVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x10))
        {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        cmCommand::SetError(local_f8,(string *)local_120);
        goto LAB_001edc8d;
      }
      pbVar1 = (local_40->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_40->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar10)
      {
        local_140 = &local_130;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_a0._M_dataplus._M_p,
                   local_a0._M_dataplus._M_p + local_a0._M_string_length);
        std::__cxx11::string::append((char *)&local_140);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_140,(ulong)local_e8._M_dataplus._M_p);
        local_168._0_8_ = local_168 + 0x10;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar7)
        {
          local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_168._24_8_ = plVar6[3];
        }
        else {
          local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_168._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
        }
        local_168._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append(local_168);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar9) {
          local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_110._8_8_ = plVar6[3];
          local_120._0_8_ = &local_110;
        }
        else {
          local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_120._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
        }
        local_120._8_8_ = plVar6[1];
        *plVar6 = (long)paVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x10))
        {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        cmCommand::SetError(local_f8,(string *)local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._0_8_ != &local_110) {
          operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
        }
        local_ec = 0;
        goto LAB_001edcaa;
      }
      pcVar2 = pbVar1[uVar10]._M_dataplus._M_p;
      local_120._0_8_ = &local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar2,pcVar2 + pbVar1[uVar10]._M_string_length);
      iVar3 = std::__cxx11::string::compare((char *)local_120);
      bVar11 = true;
      if (iVar3 == 0) {
        local_ec = 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_120);
        if (iVar3 == 0) {
          local_ec = 2;
        }
        else {
          local_c0[0] = local_b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c0,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          std::__cxx11::string::append((char *)local_c0);
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_c0,local_120._0_8_);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_70 = *plVar8;
            lStack_68 = plVar6[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar8;
            local_80 = (long *)*plVar6;
          }
          local_78 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_50 = *plVar8;
            lStack_48 = plVar6[3];
            local_60 = &local_50;
          }
          else {
            local_50 = *plVar8;
            local_60 = (long *)*plVar6;
          }
          local_58 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_60,(ulong)local_e8._M_dataplus._M_p);
          local_140 = &local_130;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_130 = *plVar8;
            lStack_128 = plVar6[3];
          }
          else {
            local_130 = *plVar8;
            local_140 = (long *)*plVar6;
          }
          local_138 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
          local_168._0_8_ = local_168 + 0x10;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2)
          ;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar7
             ) {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._24_8_ = plVar6[3];
          }
          else {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
          }
          local_168._8_8_ = plVar6[1];
          *plVar6 = (long)pbVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130 + 1);
          }
          if (local_60 != &local_50) {
            operator_delete(local_60,local_50 + 1);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_c0[0] != local_b0) {
            operator_delete(local_c0[0],local_b0[0] + 1);
          }
          cmCommand::SetError(local_f8,(string *)local_168);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          bVar11 = false;
          local_ec = 0;
        }
      }
LAB_001ee669:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ != &local_110) {
        operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
      }
      uVar10 = uVar4 + 2;
      if (bVar11) {
        bVar11 = true;
      }
      else {
        bVar11 = false;
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_e8);
      if (iVar3 == 0) {
        if (local_fc != 0) {
          local_140 = &local_130;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_140,(ulong)local_e8._M_dataplus._M_p);
          local_168._0_8_ = local_168 + 0x10;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2)
          ;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar7
             ) {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._24_8_ = plVar6[3];
          }
          else {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
          }
          local_168._8_8_ = plVar6[1];
          *plVar6 = (long)pbVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_168);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar9) {
            local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_110._8_8_ = plVar6[3];
            local_120._0_8_ = &local_110;
          }
          else {
            local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_120._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
          }
          local_120._8_8_ = plVar6[1];
          *plVar6 = (long)paVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130 + 1);
          }
          cmCommand::SetError(local_f8,(string *)local_120);
          goto LAB_001edc8d;
        }
        pbVar1 = (local_40->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (uVar10 < (ulong)((long)(local_40->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5))
        {
          pcVar2 = pbVar1[uVar10]._M_dataplus._M_p;
          local_120._0_8_ = &local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_120,pcVar2,pcVar2 + pbVar1[uVar10]._M_string_length);
          iVar3 = std::__cxx11::string::compare((char *)local_120);
          bVar11 = true;
          if (iVar3 == 0) {
            local_fc = 1;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)local_120);
            if (iVar3 == 0) {
              local_fc = 2;
            }
            else {
              local_c0[0] = local_b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_c0,local_a0._M_dataplus._M_p,
                         local_a0._M_dataplus._M_p + local_a0._M_string_length);
              std::__cxx11::string::append((char *)local_c0);
              plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_c0,local_120._0_8_);
              plVar8 = plVar6 + 2;
              if ((long *)*plVar6 == plVar8) {
                local_70 = *plVar8;
                lStack_68 = plVar6[3];
                local_80 = &local_70;
              }
              else {
                local_70 = *plVar8;
                local_80 = (long *)*plVar6;
              }
              local_78 = plVar6[1];
              *plVar6 = (long)plVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
              plVar8 = plVar6 + 2;
              if ((long *)*plVar6 == plVar8) {
                local_50 = *plVar8;
                lStack_48 = plVar6[3];
                local_60 = &local_50;
              }
              else {
                local_50 = *plVar8;
                local_60 = (long *)*plVar6;
              }
              local_58 = plVar6[1];
              *plVar6 = (long)plVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_60,(ulong)local_e8._M_dataplus._M_p);
              local_140 = &local_130;
              plVar8 = plVar6 + 2;
              if ((long *)*plVar6 == plVar8) {
                local_130 = *plVar8;
                lStack_128 = plVar6[3];
              }
              else {
                local_130 = *plVar8;
                local_140 = (long *)*plVar6;
              }
              local_138 = plVar6[1];
              *plVar6 = (long)plVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
              local_168._0_8_ = local_168 + 0x10;
              pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar6 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 ==
                  pbVar7) {
                local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
                local_168._24_8_ = plVar6[3];
              }
              else {
                local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
                local_168._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
              }
              local_168._8_8_ = plVar6[1];
              *plVar6 = (long)pbVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              if (local_140 != &local_130) {
                operator_delete(local_140,local_130 + 1);
              }
              if (local_60 != &local_50) {
                operator_delete(local_60,local_50 + 1);
              }
              if (local_80 != &local_70) {
                operator_delete(local_80,local_70 + 1);
              }
              if (local_c0[0] != local_b0) {
                operator_delete(local_c0[0],local_b0[0] + 1);
              }
              cmCommand::SetError(local_f8,(string *)local_168);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_168._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_168 + 0x10)) {
                operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
              }
              bVar11 = false;
              local_fc = 0;
            }
          }
          goto LAB_001ee669;
        }
        local_140 = &local_130;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_140,local_a0._M_dataplus._M_p,
                   local_a0._M_dataplus._M_p + local_a0._M_string_length);
        std::__cxx11::string::append((char *)&local_140);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_140,(ulong)local_e8._M_dataplus._M_p);
        local_168._0_8_ = local_168 + 0x10;
        pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar7)
        {
          local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_168._24_8_ = plVar6[3];
        }
        else {
          local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
          local_168._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
        }
        local_168._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append(local_168);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar9) {
          local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_110._8_8_ = plVar6[3];
          local_120._0_8_ = &local_110;
        }
        else {
          local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_120._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar6;
        }
        local_120._8_8_ = plVar6[1];
        *plVar6 = (long)paVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_168 + 0x10))
        {
          operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        cmCommand::SetError(local_f8,(string *)local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._0_8_ != &local_110) {
          operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
        }
        local_fc = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_e8);
        if (iVar3 == 0) {
          if (local_100 == 0) {
            pbVar1 = (local_40->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (uVar10 < (ulong)((long)(local_40->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >>
                                5)) {
              pcVar2 = pbVar1[uVar10]._M_dataplus._M_p;
              local_120._0_8_ = &local_110;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_120,pcVar2,pcVar2 + pbVar1[uVar10]._M_string_length);
              iVar3 = std::__cxx11::string::compare((char *)local_120);
              bVar11 = true;
              if (iVar3 == 0) {
                local_100 = 1;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_120);
                if (iVar3 == 0) {
                  local_100 = 2;
                }
                else {
                  local_c0[0] = local_b0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_c0,local_a0._M_dataplus._M_p,
                             local_a0._M_dataplus._M_p + local_a0._M_string_length);
                  std::__cxx11::string::append((char *)local_c0);
                  plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_c0,local_120._0_8_)
                  ;
                  plVar8 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar8) {
                    local_70 = *plVar8;
                    lStack_68 = plVar6[3];
                    local_80 = &local_70;
                  }
                  else {
                    local_70 = *plVar8;
                    local_80 = (long *)*plVar6;
                  }
                  local_78 = plVar6[1];
                  *plVar6 = (long)plVar8;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
                  plVar8 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar8) {
                    local_50 = *plVar8;
                    lStack_48 = plVar6[3];
                    local_60 = &local_50;
                  }
                  else {
                    local_50 = *plVar8;
                    local_60 = (long *)*plVar6;
                  }
                  local_58 = plVar6[1];
                  *plVar6 = (long)plVar8;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::_M_append
                                             ((char *)&local_60,(ulong)local_e8._M_dataplus._M_p);
                  local_140 = &local_130;
                  plVar8 = plVar6 + 2;
                  if ((long *)*plVar6 == plVar8) {
                    local_130 = *plVar8;
                    lStack_128 = plVar6[3];
                  }
                  else {
                    local_130 = *plVar8;
                    local_140 = (long *)*plVar6;
                  }
                  local_138 = plVar6[1];
                  *plVar6 = (long)plVar8;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  plVar6 = (long *)std::__cxx11::string::append((char *)&local_140);
                  local_168._0_8_ = local_168 + 0x10;
                  pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar6 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6
                      == pbVar7) {
                    local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
                    local_168._24_8_ = plVar6[3];
                  }
                  else {
                    local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
                    local_168._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *plVar6;
                  }
                  local_168._8_8_ = plVar6[1];
                  *plVar6 = (long)pbVar7;
                  plVar6[1] = 0;
                  *(undefined1 *)(plVar6 + 2) = 0;
                  if (local_140 != &local_130) {
                    operator_delete(local_140,local_130 + 1);
                  }
                  if (local_60 != &local_50) {
                    operator_delete(local_60,local_50 + 1);
                  }
                  if (local_80 != &local_70) {
                    operator_delete(local_80,local_70 + 1);
                  }
                  if (local_c0[0] != local_b0) {
                    operator_delete(local_c0[0],local_b0[0] + 1);
                  }
                  cmCommand::SetError(local_f8,(string *)local_168);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_168._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_168 + 0x10)) {
                    operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
                  }
                  local_100 = 0;
                  bVar11 = false;
                }
              }
              goto LAB_001ee669;
            }
            local_140 = &local_130;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,local_a0._M_dataplus._M_p,
                       local_a0._M_dataplus._M_p + local_a0._M_string_length);
            std::__cxx11::string::append((char *)&local_140);
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_140,(ulong)local_e8._M_dataplus._M_p);
            local_168._0_8_ = local_168 + 0x10;
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar6 + 2);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 ==
                pbVar7) {
              local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
              local_168._24_8_ = plVar6[3];
            }
            else {
              local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
              local_168._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
            }
            local_168._8_8_ = plVar6[1];
            *plVar6 = (long)pbVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)std::__cxx11::string::append(local_168);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar9) {
              local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_110._8_8_ = plVar6[3];
              local_120._0_8_ = &local_110;
            }
            else {
              local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_120._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_120._8_8_ = plVar6[1];
            *plVar6 = (long)paVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_168 + 0x10)) {
              operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
            }
            if (local_140 != &local_130) {
              operator_delete(local_140,local_130 + 1);
            }
            cmCommand::SetError(local_f8,(string *)local_120);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._0_8_ != &local_110) {
              operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
            }
            local_100 = 0;
            goto LAB_001edcaa;
          }
          local_140 = &local_130;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_140,(ulong)local_e8._M_dataplus._M_p);
          local_168._0_8_ = local_168 + 0x10;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2)
          ;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar7
             ) {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._24_8_ = plVar6[3];
          }
          else {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
          }
          local_168._8_8_ = plVar6[1];
          *plVar6 = (long)pbVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_168);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar9) {
            local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_110._8_8_ = plVar6[3];
            local_120._0_8_ = &local_110;
          }
          else {
            local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_120._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
          }
          local_120._8_8_ = plVar6[1];
          *plVar6 = (long)paVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130 + 1);
          }
          cmCommand::SetError(local_f8,(string *)local_120);
        }
        else {
          local_140 = &local_130;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,local_a0._M_dataplus._M_p,
                     local_a0._M_dataplus._M_p + local_a0._M_string_length);
          std::__cxx11::string::append((char *)&local_140);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_140,(ulong)local_e8._M_dataplus._M_p);
          local_168._0_8_ = local_168 + 0x10;
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2)
          ;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar7
             ) {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._24_8_ = plVar6[3];
          }
          else {
            local_168._16_8_ = (pbVar7->_M_dataplus)._M_p;
            local_168._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
          }
          local_168._8_8_ = plVar6[1];
          *plVar6 = (long)pbVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_168);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar9) {
            local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_110._8_8_ = plVar6[3];
            local_120._0_8_ = &local_110;
          }
          else {
            local_110._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_120._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
          }
          local_120._8_8_ = plVar6[1];
          *plVar6 = (long)paVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130 + 1);
          }
          cmCommand::SetError(local_f8,(string *)local_120);
        }
LAB_001edc8d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._0_8_ != &local_110) {
          operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
        }
      }
LAB_001edcaa:
      bVar11 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    uVar4 = uVar10;
    if (!bVar11) goto LAB_001ee86b;
  }
  local_168._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_168._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_168._16_8_ = (pointer)0x0;
  bVar11 = GetList((cmListCommand *)local_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_168,pbVar1 + 1);
  __last = local_168._8_8_;
  __first = local_168._0_8_;
  if (bVar11) {
    if (local_100 < 2 && (local_fc < 2 && local_ec < 2)) {
      if (local_168._0_8_ != local_168._8_8_) {
        uVar4 = (long)(local_168._8_8_ - local_168._0_8_) >> 5;
        lVar5 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_168._0_8_,local_168._8_8_,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (__first,__last);
      }
    }
    else {
      local_120._8_8_ = (StringFilter)0x0;
      local_120._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (local_ec == 2) {
        local_120._0_8_ = cmsys::SystemTools::GetFilenameName;
      }
      if (local_fc == 2) {
        local_120._8_8_ = cmsys::SystemTools::LowerCase;
      }
      local_110._M_local_buf[0] = local_100 == 2;
      local_e8.field_2._M_allocated_capacity = local_110._M_allocated_capacity;
      local_e8._M_dataplus._M_p = (pointer)local_120._0_8_;
      local_e8._M_string_length = local_120._8_8_;
      if (local_168._0_8_ != local_168._8_8_) {
        uVar4 = (long)(local_168._8_8_ - local_168._0_8_) >> 5;
        lVar5 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        __comp._M_comp.filters[1] = (StringFilter)local_120._8_8_;
        __comp._M_comp.filters[0] = (StringFilter)local_120._0_8_;
        __comp._M_comp._16_8_ = local_110._M_allocated_capacity;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmStringSorter>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_168._0_8_,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )local_168._8_8_,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,__comp);
        __comp_00._M_comp.filters[1] = (StringFilter)local_e8._M_string_length;
        __comp_00._M_comp.filters[0] = (StringFilter)local_e8._M_dataplus._M_p;
        __comp_00._M_comp._16_8_ = local_e8.field_2._M_allocated_capacity;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmStringSorter>>
                  ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last,__comp_00);
      }
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_e8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168,";");
    cmMakefile::AddDefinition(local_f8->Makefile,pbVar1 + 1,local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
LAB_001ee86b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return (bool)(undefined1)local_34;
}

Assistant:

bool cmListCommand::HandleSortCommand(std::vector<std::string> const& args)
{
  assert(args.size() >= 2);
  if (args.size() > 8) {
    this->SetError("sub-command SORT only takes up to six arguments.");
    return false;
  }

  auto sortCompare = cmStringSorter::Compare::UNINITIALIZED;
  auto sortCaseSensitivity = cmStringSorter::CaseSensitivity::UNINITIALIZED;
  auto sortOrder = cmStringSorter::Order::UNINITIALIZED;

  size_t argumentIndex = 2;
  const std::string messageHint = "sub-command SORT ";

  while (argumentIndex < args.size()) {
    const std::string option = args[argumentIndex++];
    if (option == "COMPARE") {
      if (sortCompare != cmStringSorter::Compare::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "STRING") {
          sortCompare = cmStringSorter::Compare::STRING;
        } else if (argument == "FILE_BASENAME") {
          sortCompare = cmStringSorter::Compare::FILE_BASENAME;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else if (option == "CASE") {
      if (sortCaseSensitivity !=
          cmStringSorter::CaseSensitivity::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "SENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
        } else if (argument == "INSENSITIVE") {
          sortCaseSensitivity = cmStringSorter::CaseSensitivity::INSENSITIVE;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else if (option == "ORDER") {

      if (sortOrder != cmStringSorter::Order::UNINITIALIZED) {
        std::string error = messageHint + "option \"" + option +
          "\" has been specified multiple times.";
        this->SetError(error);
        return false;
      }
      if (argumentIndex < args.size()) {
        const std::string argument = args[argumentIndex++];
        if (argument == "ASCENDING") {
          sortOrder = cmStringSorter::Order::ASCENDING;
        } else if (argument == "DESCENDING") {
          sortOrder = cmStringSorter::Order::DESCENDING;
        } else {
          std::string error = messageHint + "value \"" + argument +
            "\" for option \"" + option + "\" is invalid.";
          this->SetError(error);
          return false;
        }
      } else {
        std::string error =
          messageHint + "missing argument for option \"" + option + "\".";
        this->SetError(error);
        return false;
      }
    } else {
      std::string error =
        messageHint + "option \"" + option + "\" is unknown.";
      this->SetError(error);
      return false;
    }
  }
  // set Default Values if Option is not given
  if (sortCompare == cmStringSorter::Compare::UNINITIALIZED) {
    sortCompare = cmStringSorter::Compare::STRING;
  }
  if (sortCaseSensitivity == cmStringSorter::CaseSensitivity::UNINITIALIZED) {
    sortCaseSensitivity = cmStringSorter::CaseSensitivity::SENSITIVE;
  }
  if (sortOrder == cmStringSorter::Order::UNINITIALIZED) {
    sortOrder = cmStringSorter::Order::ASCENDING;
  }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!this->GetList(varArgsExpanded, listName)) {
    return true;
  }

  if ((sortCompare == cmStringSorter::Compare::STRING) &&
      (sortCaseSensitivity == cmStringSorter::CaseSensitivity::SENSITIVE) &&
      (sortOrder == cmStringSorter::Order::ASCENDING)) {
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end());
  } else {
    cmStringSorter sorter(sortCompare, sortCaseSensitivity, sortOrder);
    std::sort(varArgsExpanded.begin(), varArgsExpanded.end(), sorter);
  }

  std::string value = cmJoin(varArgsExpanded, ";");
  this->Makefile->AddDefinition(listName, value.c_str());
  return true;
}